

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlareState.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::FlareState::FlareState(FlareState *this)

{
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__FlareState_00224600;
  this->m_ui32TSC = 0;
  EntityType::EntityType(&this->m_Src);
  this->m_ui16GeometryIndex = 0;
  this->m_ui16Padding = 0;
  this->m_ui32NumInt = 0;
  this->m_ui32NumSrcs = 0;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x103;
  (this->super_EnvironmentRecord).m_ui16Length = 0x100;
  return;
}

Assistant:

FlareState::FlareState() :
    m_ui32TSC( 0 ),
    m_ui32NumInt( 0 ),
    m_ui32NumSrcs( 0 ),
    m_ui16GeometryIndex( 0 ),
    m_ui16Padding( 0 )
{
    m_ui32EnvRecTyp = FlareStateType;
    m_ui16Length = FLARE_STATE_SIZE * 8;
}